

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ActionBlockSyntax * __thiscall slang::parsing::Parser::parseActionBlock(Parser *this)

{
  bool bVar1;
  StatementSyntax *pSVar2;
  ActionBlockSyntax *pAVar3;
  SyntaxFactory *in_RDI;
  ElseClauseSyntax *elseClause;
  StatementSyntax *statement;
  Parser *in_stack_00000028;
  undefined1 in_stack_00000b16;
  undefined1 in_stack_00000b17;
  Parser *in_stack_00000b18;
  StatementSyntax *in_stack_ffffffffffffffd8;
  
  bVar1 = ParserBase::peek((ParserBase *)0x0,Unknown);
  if (bVar1) {
    parseElseClause(in_stack_00000028);
  }
  else {
    pSVar2 = parseStatement(in_stack_00000b18,(bool)in_stack_00000b17,(bool)in_stack_00000b16);
    if ((pSVar2->super_SyntaxNode).kind != EmptyStatement) {
      parseElseClause(in_stack_00000028);
    }
  }
  pAVar3 = slang::syntax::SyntaxFactory::actionBlock
                     (in_RDI,in_stack_ffffffffffffffd8,(ElseClauseSyntax *)0x6f5195);
  return pAVar3;
}

Assistant:

ActionBlockSyntax& Parser::parseActionBlock() {
    StatementSyntax* statement = nullptr;
    ElseClauseSyntax* elseClause = nullptr;

    if (peek(TokenKind::ElseKeyword))
        elseClause = parseElseClause();
    else {
        statement = &parseStatement();
        if (statement->kind != SyntaxKind::EmptyStatement)
            elseClause = parseElseClause();
    }

    return factory.actionBlock(statement, elseClause);
}